

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O0

string * __thiscall
ritobin::io::write_binary_abi_cxx11_
          (string *__return_storage_ptr__,io *this,Bin *bin,vector<char,_std::allocator<char>_> *out
          ,BinCompat *compat)

{
  bool bVar1;
  BinCompat **this_00;
  undefined1 local_50 [8];
  BinBinaryWriter writer;
  BinCompat *compat_local;
  vector<char,_std::allocator<char>_> *out_local;
  Bin *bin_local;
  
  this_00 = &writer.writer.compat_;
  local_50 = (undefined1  [8])bin;
  writer.writer.buffer_ = out;
  writer.error.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)out;
  memset(this_00,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  bVar1 = impl_binary_write::BinBinaryWriter::process((BinBinaryWriter *)local_50,(Bin *)this);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    impl_binary_write::BinBinaryWriter::trace_error_abi_cxx11_
              (__return_storage_ptr__,(BinBinaryWriter *)local_50);
  }
  impl_binary_write::BinBinaryWriter::~BinBinaryWriter((BinBinaryWriter *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string write_binary(Bin const& bin, std::vector<char>& out, BinCompat const* compat) noexcept {
        BinBinaryWriter writer = { { out, compat }, {} };
        if (!writer.process(bin)) {
            return writer.trace_error();
        }
        return {};
    }